

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

variables_map * validate_args(int ac,char **av)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  typed_value<unsigned_short,_char> *ptVar3;
  typed_value<long,_char> *ptVar4;
  typed_value<int,_char> *ptVar5;
  const_iterator cVar6;
  ostream *poVar7;
  char **in_RDX;
  undefined4 in_register_0000003c;
  variables_map *this;
  options_description desc;
  undefined1 local_100 [16];
  undefined1 local_f0 [40];
  long *local_c8;
  long local_b8 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_a0 [24];
  void *local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_70;
  long local_68;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_60 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  this = (variables_map *)CONCAT44(in_register_0000003c,ac);
  local_100._0_8_ = (pointer)local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)&local_c8,(string *)local_100,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_100._0_8_ != (pointer)local_f0) {
    operator_delete((void *)local_100._0_8_,(ulong)(local_f0._0_8_ + 1));
  }
  local_100._0_8_ = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_100,"help,h");
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ptVar2->m_required = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"mcast,g",(char *)ptVar2);
  ptVar3 = boost::program_options::value<unsigned_short>((unsigned_short *)0x0);
  ptVar3->m_required = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"udp-port,p",(char *)ptVar3);
  ptVar4 = boost::program_options::value<long>((long *)0x0);
  local_f0._32_8_ = 0x3200000;
  ptVar4 = boost::program_options::typed_value<long,_char>::default_value
                     (ptVar4,(long *)(local_f0 + 0x20));
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"max-space,b",(char *)ptVar4);
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ptVar2->m_required = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"shared-folder,f",(char *)ptVar2);
  ptVar5 = boost::program_options::value<int>((int *)0x0);
  local_f0._28_4_ = 5;
  ptVar5 = boost::program_options::typed_value<int,_char>::default_value
                     (ptVar5,(int *)(local_f0 + 0x1c));
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"timeout,t",(char *)ptVar5);
  boost::program_options::variables_map::variables_map(this);
  local_48.super_function_base.vtable = (vtable_base *)0x0;
  local_48.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_48.super_function_base.functor._8_8_ = 0;
  local_48.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_100,(int)av,in_RDX,(options_description *)&local_c8
             ,0,&local_48);
  boost::program_options::store((basic_parsed_options *)local_100,this,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_100);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_48);
  local_100._0_8_ = (pointer)local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"help","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)(this + 0x10),(key_type *)local_100);
  if ((pointer)local_100._0_8_ != (pointer)local_f0) {
    operator_delete((void *)local_100._0_8_,(ulong)(local_f0._0_8_ + 1));
  }
  if (cVar6._M_node == (_Base_ptr)(this + 0x18)) {
    boost::program_options::notify(this);
    std::
    vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
    ::~vector(local_60);
    if (local_88 != (void *)0x0) {
      operator_delete(local_88,local_68 - (long)local_88);
      local_88 = (void *)0x0;
      local_80 = 0;
      local_78 = 0;
      local_70 = 0;
      local_68 = 0;
    }
    std::
    vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
    ::~vector(local_a0);
    if (local_c8 != local_b8) {
      operator_delete(local_c8,local_b8[0] + 1);
    }
    return this;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File store server",0x11)
  ;
  poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar7 = (ostream *)boost::program_options::operator<<(poVar7,(options_description *)&local_c8);
  std::endl<char,std::char_traits<char>>(poVar7);
  exit(0);
}

Assistant:

po::variables_map validate_args(int ac, char **av) {
  boost::program_options::options_description desc("Allowed options");
  desc.add_options()
      ("help,h", "Help")
      ("mcast,g", po::value<std::string>()->required(), "Multicast address")
      ("udp-port,p", po::value<uint16_t>()->required(), "UDP port")
      ("max-space,b", po::value<long>()->default_value(52428800), "Max space in folder")
      ("shared-folder,f", po::value<std::string>()->required(), "Shared folder")
      ("timeout,t", po::value<int>()->default_value(5), "Wait timeout");
  po::variables_map vm;
  try {
    po::store(po::parse_command_line(ac, av, desc), vm);
    if (vm.count("help")) {
      std::cout << "File store server" << std::endl
                << desc << std::endl;
      exit(0);
    }
    po::notify(vm);
  } catch (po::error &e) {
    std::cerr << "ERROR: " << e.what() << std::endl << std::endl;
    std::cerr << desc << std::endl;
    exit(1);
  }
  return vm;
}